

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

GLuint __thiscall
Outputs::Display::OpenGL::Shader::compile_shader(Shader *this,string *source,GLenum type)

{
  GLuint GVar1;
  ostream *poVar2;
  size_type __n;
  char *pcVar3;
  uint *puVar4;
  LogLine local_80;
  uint local_78;
  GLenum error_4;
  allocator_type local_61;
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> log;
  size_type length;
  GLenum error_3;
  GLint logLength;
  GLenum error_2;
  GLint isCompiled;
  GLenum error_1;
  GLenum error;
  char *c_str;
  GLuint shader;
  GLenum type_local;
  string *source_local;
  Shader *this_local;
  
  c_str._4_4_ = type;
  _shader = source;
  source_local = (string *)this;
  c_str._0_4_ = glCreateShader(type);
  _error_1 = std::__cxx11::string::c_str();
  glShaderSource((GLuint)c_str,1,&error_1);
  isCompiled = glGetError();
  if (isCompiled != 0) {
    switch(isCompiled) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar2,isCompiled);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                  ,0x18,
                  "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                 );
  }
  glCompileShader((GLuint)c_str);
  error_2 = glGetError();
  if (error_2 != 0) {
    switch(error_2) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar2,error_2);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                  ,0x19,
                  "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                 );
  }
  logLength = 0;
  glGetShaderiv((GLuint)c_str,0x8b81,&logLength);
  error_3 = glGetError();
  if (error_3 != 0) {
    switch(error_3) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar2,error_3);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1d);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                  ,0x1d,
                  "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                 );
  }
  if (logLength == 0) {
    glGetShaderiv((GLuint)c_str,0x8b84,(long)&length + 4);
    length._0_4_ = glGetError();
    if ((uint)length != 0) {
      switch((uint)length) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar2,(uint)length);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar2 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
      poVar2 = std::operator<<(poVar2," in ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                    ,0x20,
                    "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                   );
    }
    if (0 < length._4_4_) {
      __n = (size_type)length._4_4_;
      log.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = __n;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_60,__n,&local_61);
      std::allocator<char>::~allocator(&local_61);
      GVar1 = (GLuint)c_str;
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)local_60);
      glGetShaderInfoLog(GVar1,length._4_4_,(long)&length + 4);
      local_78 = glGetError();
      if (local_78 != 0) {
        switch(local_78) {
        case 0x500:
          std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
          break;
        case 0x501:
          std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
          break;
        case 0x502:
          std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
          break;
        default:
          poVar2 = std::operator<<((ostream *)&std::cerr,"Error ");
          std::ostream::operator<<(poVar2,local_78);
          break;
        case 0x505:
          std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
          break;
        case 0x506:
          std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
        }
        poVar2 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x24);
        poVar2 = std::operator<<(poVar2," in ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                      ,0x24,
                      "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                     );
      }
      Log::Logger<(Log::Source)24>::error((Logger<(Log::Source)24> *)&local_80);
      pcVar3 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_60);
      Log::Logger<(Log::Source)24>::LogLine::append(&local_80,"Compile log: %s",pcVar3);
      Log::Logger<(Log::Source)24>::LogLine::~LogLine(&local_80);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_60);
    }
    puVar4 = (uint *)__cxa_allocate_exception(4);
    *puVar4 = (uint)(c_str._4_4_ != 0x8b31);
    __cxa_throw(puVar4,&{unnamed_type#1}::typeinfo,0);
  }
  return (GLuint)c_str;
}

Assistant:

GLuint Shader::compile_shader(const std::string &source, GLenum type) {
	GLuint shader = glCreateShader(type);
	const char *c_str = source.c_str();
	test_gl(glShaderSource, shader, 1, &c_str, NULL);
	test_gl(glCompileShader, shader);

	if constexpr (logger.enabled) {
		GLint isCompiled = 0;
		test_gl(glGetShaderiv, shader, GL_COMPILE_STATUS, &isCompiled);
		if(isCompiled == GL_FALSE) {
			GLint logLength;
			test_gl(glGetShaderiv, shader, GL_INFO_LOG_LENGTH, &logLength);
			if(logLength > 0) {
				const auto length = std::vector<GLchar>::size_type(logLength);
				std::vector<GLchar> log(length);
				test_gl(glGetShaderInfoLog, shader, logLength, &logLength, log.data());
				logger.error().append("Compile log: %s", log.data());
			}

			throw (type == GL_VERTEX_SHADER) ? VertexShaderCompilationError : FragmentShaderCompilationError;
		}
	}

	return shader;
}